

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::set_error(torrent *this,error_code *ec,file_index_t error_file)

{
  int *piVar1;
  error_category *peVar2;
  bool bVar3;
  undefined3 uVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char buf [1024];
  undefined1 local_468 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  string local_428 [32];
  
  bVar3 = ec->failed_;
  uVar4 = *(undefined3 *)&ec->field_0x5;
  peVar2 = ec->cat_;
  (this->m_error).val_ = ec->val_;
  (this->m_error).failed_ = bVar3;
  *(undefined3 *)&(this->m_error).field_0x5 = uVar4;
  (this->m_error).cat_ = peVar2;
  (this->m_error_file).m_val = error_file.m_val;
  update_gauge(this);
  iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  if ((*(uint *)(CONCAT44(extraout_var,iVar6) + 0x68) & 0x41) != 0) {
    iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)local_468);
    resolve_filename_abi_cxx11_(local_428,this,error_file);
    alert_manager::
    emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code_const&,std::__cxx11::string>
              ((alert_manager *)CONCAT44(extraout_var_00,iVar6),(torrent_handle *)local_468,ec,
               local_428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428[0]._M_dataplus._M_p != &local_428[0].field_2) {
      operator_delete(local_428[0]._M_dataplus._M_p,local_428[0].field_2._M_allocated_capacity + 1);
    }
    if ((tuple<libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
        )local_468._8_8_ != (_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_468._8_8_)->
                                super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ).
                                super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4);
        iVar6 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar6 = *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_468._8_8_)->
                                super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ).
                                super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4);
        *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_468._8_8_)->
                        super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                        ).
                        super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar6 + -1;
      }
      if (iVar6 == 1) {
        (*(code *)(((vector<piece_pos,_piece_index_t> *)local_468._8_8_)->
                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ).
                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ._M_impl.super__Vector_impl_data._M_start[3])();
      }
    }
  }
  if (ec->failed_ == true) {
    (*ec->cat_->_vptr_error_category[4])(local_468,ec->cat_,(ulong)(uint)ec->val_);
    uVar5 = local_468._0_8_;
    resolve_filename_abi_cxx11_((string *)(local_468 + 0x20),this,error_file);
    snprintf((char *)local_428,0x400,"error %s: %s",uVar5,local_468._32_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._32_8_ != &local_438) {
      operator_delete((void *)local_468._32_8_,(ulong)(local_438._M_allocated_capacity + 1));
    }
    if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
      operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
    }
    log_to_all_peers(this,(char *)local_428);
  }
  state_updated(this);
  update_state_list(this);
  return;
}

Assistant:

void torrent::set_error(error_code const& ec, file_index_t const error_file)
	{
		TORRENT_ASSERT(is_single_thread());
		m_error = ec;
		m_error_file = error_file;

		update_gauge();

		if (alerts().should_post<torrent_error_alert>())
			alerts().emplace_alert<torrent_error_alert>(get_handle(), ec
				, resolve_filename(error_file));

#ifndef TORRENT_DISABLE_LOGGING
		if (ec)
		{
			char buf[1024];
			std::snprintf(buf, sizeof(buf), "error %s: %s", ec.message().c_str()
				, resolve_filename(error_file).c_str());
			log_to_all_peers(buf);
		}
#endif

		state_updated();
		update_state_list();
	}